

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Statements.cpp
# Opt level: O2

StatementContext psy::C::operator+(StatementContext a,StatementContext b)

{
  ostream *poVar1;
  undefined7 in_register_00000039;
  
  switch(CONCAT71(in_register_00000039,a) & 0xffffffff) {
  case 0:
    goto switchD_002f78e4_caseD_0;
  case 1:
    b = (b == Loop) * '\x02' + Switch;
switchD_002f78e4_caseD_0:
    return b;
  case 2:
    return b == Switch | Loop;
  case 3:
    return SwitchAndLoop;
  default:
    poVar1 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Statements.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x41f);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,"");
    std::endl<char,std::char_traits<char>>(poVar1);
    return None;
  }
}

Assistant:

Parser::StatementContext operator+(Parser::StatementContext a,
                                   Parser::StatementContext b)
{
    switch (a) {
        case Parser::StatementContext::None:
            return b;

        case Parser::StatementContext::Switch:
            if (b == Parser::StatementContext::Loop)
                return Parser::StatementContext::SwitchAndLoop;
            return a;

        case Parser::StatementContext::Loop:
            if (b == Parser::StatementContext::Switch)
                return Parser::StatementContext::SwitchAndLoop;
            return a;

        case Parser::StatementContext::SwitchAndLoop:
            return a;

        default:
            PSY_ASSERT_3(false, return Parser::StatementContext::None, "");
    }
}